

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O1

Vec_Ptr_t * Pdr_ManCollectCubes(Pdr_Man_t *p,int kStart)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Vec_t *pVVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  pVVar7 = p->vClauses;
  if (kStart < pVVar7->nSize) {
    uVar9 = (ulong)(uint)kStart;
    do {
      if (kStart < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar2 = pVVar7->pArray[uVar9];
      if (0 < *(int *)((long)pvVar2 + 4)) {
        uVar8 = pVVar5->nCap;
        iVar1 = pVVar5->nSize;
        ppvVar6 = pVVar5->pArray;
        lVar10 = 0;
        do {
          pvVar3 = *(void **)(*(long *)((long)pvVar2 + 8) + lVar10 * 8);
          if ((int)lVar10 + iVar1 == uVar8) {
            if ((int)uVar8 < 0x10) {
              if (ppvVar6 == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(ppvVar6,0x80);
              }
              uVar8 = 0x10;
            }
            else {
              uVar4 = uVar8 * 2;
              if (SBORROW4(uVar8,uVar4) != 0 < (int)uVar8) {
                uVar8 = uVar4;
                if (ppvVar6 == (void **)0x0) {
                  ppvVar6 = (void **)malloc((ulong)uVar4 << 3);
                }
                else {
                  ppvVar6 = (void **)realloc(ppvVar6,(ulong)uVar4 << 3);
                }
              }
            }
          }
          ppvVar6[iVar1 + lVar10] = pvVar3;
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)((long)pvVar2 + 4));
        pVVar5->nSize = iVar1 + (int)lVar10;
        pVVar5->nCap = uVar8;
        pVVar5->pArray = ppvVar6;
      }
      uVar9 = uVar9 + 1;
      pVVar7 = p->vClauses;
    } while ((int)uVar9 < pVVar7->nSize);
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Pdr_ManCollectCubes( Pdr_Man_t * p, int kStart )
{
    Vec_Ptr_t * vResult;
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pSet;
    int i, j;
    vResult = Vec_PtrAlloc( 100 );
    Vec_VecForEachLevelStart( p->vClauses, vArrayK, i, kStart )
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pSet, j )
            Vec_PtrPush( vResult, pSet );
    return vResult;
}